

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::TuplePrefix<3ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<unsigned_long>,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<ot::commissioner::JoinerType,unsigned_long,std::__cxx11::string_const&,std::__cxx11::string_const&>>
               (tuple<testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                *matcher_tuple,
               tuple<ot::commissioner::JoinerType,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *value_tuple)

{
  element_type *peVar1;
  bool bVar2;
  undefined1 uVar3;
  DummyMatchResultListener dummy;
  int iVar4;
  
  bVar2 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<unsigned_long>,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<ot::commissioner::JoinerType,unsigned_long,std::__cxx11::string_const&,std::__cxx11::string_const&>>
                    (matcher_tuple,value_tuple);
  if (bVar2) {
    peVar1 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_long>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             .
             super__Tuple_impl<2UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             .
             super__Head_base<2UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
             ._M_head_impl.
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar1,(value_tuple->
                              super__Tuple_impl<0UL,_ot::commissioner::JoinerType,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ).
                              super__Tuple_impl<1UL,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              .
                              super__Tuple_impl<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              .
                              super__Head_base<2UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                              ._M_head_impl);
    uVar3 = (undefined1)iVar4;
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }